

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmInfo.cpp
# Opt level: O3

void GmmCreateMultiAdapterContext(void)

{
  if (pGmmMALibContext != (GMM_MA_LIB_CONTEXT *)0x0) {
    return;
  }
  pGmmMALibContext = (GMM_MA_LIB_CONTEXT *)malloc(0xd8);
  if (pGmmMALibContext != (GMM_MA_LIB_CONTEXT *)0x0) {
    pGmmMALibContext->pCpuReserveBase = (void *)0x0;
    pGmmMALibContext->CpuReserveSize = 0;
    pGmmMALibContext->pHeadNode = (GMM_ADAPTER_INFO *)0x0;
    (pGmmMALibContext->MAContextSyncMutex).__align = 0;
    *(undefined8 *)((long)&pGmmMALibContext->MAContextSyncMutex + 8) = 0;
    *(undefined8 *)((long)&pGmmMALibContext->MAContextSyncMutex + 0x10) = 0;
    (pGmmMALibContext->MAContextSyncMutex).__data.__list.__prev = (__pthread_internal_list *)0x0;
    *(undefined8 *)((long)&(pGmmMALibContext->MAContextSyncMutex).__data.__list.__prev + 4) = 0;
    *(undefined8 *)((long)&(pGmmMALibContext->MAContextSyncMutex).__data.__list.__next + 4) = 0;
  }
  return;
}

Assistant:

GMM_LIB_API_CONSTRUCTOR void GmmCreateMultiAdapterContext()
{
    if(!pGmmMALibContext)
    {
        // This is called only during dll load
        // Initializes the MA context.
	pGmmMALibContext = new GMM_MA_LIB_CONTEXT();
    }
}